

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<VkSpecParser::TypedName>::copyAppend
          (QGenericArrayOps<VkSpecParser::TypedName> *this,TypedName *b,TypedName *e)

{
  qsizetype *pqVar1;
  TypedName *pTVar2;
  long lVar3;
  Data *pDVar4;
  
  if ((b != e) && (b < e)) {
    pTVar2 = (this->super_QArrayDataPointer<VkSpecParser::TypedName>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<VkSpecParser::TypedName>).size;
      pDVar4 = (b->name).d.d;
      pTVar2[lVar3].name.d.d = pDVar4;
      pTVar2[lVar3].name.d.ptr = (b->name).d.ptr;
      pTVar2[lVar3].name.d.size = (b->name).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar4 = (b->type).d.d;
      pTVar2[lVar3].type.d.d = pDVar4;
      pTVar2[lVar3].type.d.ptr = (b->type).d.ptr;
      pTVar2[lVar3].type.d.size = (b->type).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar4 = (b->typeSuffix).d.d;
      pTVar2[lVar3].typeSuffix.d.d = pDVar4;
      pTVar2[lVar3].typeSuffix.d.ptr = (b->typeSuffix).d.ptr;
      pTVar2[lVar3].typeSuffix.d.size = (b->typeSuffix).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<VkSpecParser::TypedName>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }